

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L;
  TValue *i_o;
  TString *key;
  TValue *pTVar1;
  
  L = ls->L;
  key = luaS_newlstr(L,str,l);
  pTVar1 = luaH_setstr(L,ls->fs->h,key);
  if (pTVar1->tt == 0) {
    (pTVar1->value).b = 1;
    pTVar1->tt = 1;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
  }
  return key;
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TString *ts = luaS_newlstr(L, str, l);
  TValue *o = luaH_setstr(L, ls->fs->h, ts);  /* entry for `str' */
  if (ttisnil(o)) {
    setbvalue(o, 1);  /* make sure `str' will not be collected */
    luaC_checkGC(L);
  }
  return ts;
}